

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O3

wchar_t apply_curse(object *obj,wchar_t lev)

{
  _Bool _Var1;
  int16_t iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  wchar_t power;
  bool bVar6;
  
  uVar3 = Rand_div(4);
  uVar4 = Rand_div(9);
  iVar2 = m_bonus(9,lev);
  _Var1 = flag_has_dbg(obj->flags,6,0x12,"obj->flags","OF_BLESSED");
  if (uVar3 != 0xffffffff && !_Var1) {
    power = uVar4 + iVar2 * 10 + L'\x01';
    do {
      iVar5 = -4;
      do {
        iVar5 = iVar5 + 1;
        if (iVar5 == 0) goto LAB_001a8116;
        uVar4 = Rand_div(z_info->curse_max - 1);
      } while (curses[uVar4 + L'\x01'].poss[obj->tval] != true);
      _Var1 = append_object_curse(obj,uVar4 + L'\x01',power);
      if (_Var1) {
        uVar4 = Rand_div(power / 10 + 1);
        lev = lev + uVar4 + L'\x01';
      }
LAB_001a8116:
      bVar6 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar6);
  }
  return lev;
}

Assistant:

static int apply_curse(struct object *obj, int lev)
{
	int pick, max_curses = randint1(4);
	int power = randint1(9) + 10 * m_bonus(9, lev);
	int new_lev = lev;

	if (of_has(obj->flags, OF_BLESSED)) return lev;

	while (max_curses--) {
		/* Try to curse it */
		int tries = 3;
		while (tries--) {
			pick = randint1(z_info->curse_max - 1);
			if (curses[pick].poss[obj->tval]) {
				if (append_object_curse(obj, pick, power)) {
					new_lev += randint1(1 + power / 10);
				}
				break;
			}
		}
	}

	return new_lev;
}